

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
::cni_holder(cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
             *this,_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr__Ios_Seekdir_numeric_ptr
                   **func)

{
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
  *in_RDI;
  cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
  *this_00;
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
  *in_stack_ffffffffffffffc0;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr__Ios_Seekdir_numeric_ptr
  *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003bac18;
  this_00 = (cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(std::shared_ptr<std::ostream>&,std::_Ios_Seekdir,cs::numeric_const&)>::
  function<void(*const&)(std::shared_ptr<std::ostream>&,std::_Ios_Seekdir,cs::numeric_const&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
  ::cni_helper(this_00,in_RDI);
  std::
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
  ::~function((function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::_Ios_Seekdir,_const_cs::numeric_&)>
               *)0x2926d6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}